

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O0

int archive_read_disk_set_standard_lookup(archive *a)

{
  _func_char_ptr_void_ptr_int64_t *lookup_gname;
  _func_void_void_ptr *cleanup_gname;
  archive *in_RDI;
  name_cache *gcache;
  name_cache *ucache;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  lookup_gname = (_func_char_ptr_void_ptr_int64_t *)malloc(0x818);
  cleanup_gname = (_func_void_void_ptr *)malloc(0x818);
  if ((lookup_gname == (_func_char_ptr_void_ptr_int64_t *)0x0) ||
     (cleanup_gname == (_func_void_void_ptr *)0x0)) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate uname/gname lookup cache");
    free(lookup_gname);
    free(cleanup_gname);
    iVar1 = -0x1e;
  }
  else {
    memset(lookup_gname,0,0x818);
    *(archive **)lookup_gname = in_RDI;
    *(undefined8 *)(lookup_gname + 0x20) = 0x7f;
    memset(cleanup_gname,0,0x818);
    *(archive **)cleanup_gname = in_RDI;
    *(undefined8 *)(cleanup_gname + 0x20) = 0x7f;
    archive_read_disk_set_gname_lookup
              ((archive *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               lookup_gname,cleanup_gname);
    archive_read_disk_set_uname_lookup
              ((archive *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               lookup_gname,cleanup_gname);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
archive_read_disk_set_standard_lookup(struct archive *a)
{
	struct name_cache *ucache = malloc(sizeof(struct name_cache));
	struct name_cache *gcache = malloc(sizeof(struct name_cache));

	if (ucache == NULL || gcache == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate uname/gname lookup cache");
		free(ucache);
		free(gcache);
		return (ARCHIVE_FATAL);
	}

	memset(ucache, 0, sizeof(*ucache));
	ucache->archive = a;
	ucache->size = name_cache_size;
	memset(gcache, 0, sizeof(*gcache));
	gcache->archive = a;
	gcache->size = name_cache_size;

	archive_read_disk_set_gname_lookup(a, gcache, lookup_gname, cleanup);
	archive_read_disk_set_uname_lookup(a, ucache, lookup_uname, cleanup);

	return (ARCHIVE_OK);
}